

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupTopAnd(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  bool bVar3;
  
  p_00 = Gia_ManDupNormalize(p,0);
  bVar3 = true;
  while (bVar3) {
    p_01 = Gia_ManDupTopAnd_iter(p_00,fVerbose);
    bVar3 = true;
    if (p_01->vCos->nSize == p_00->vCos->nSize) {
      iVar1 = Gia_ManAndNum(p_01);
      iVar2 = Gia_ManAndNum(p_00);
      bVar3 = iVar1 != iVar2;
    }
    Gia_ManStop(p_00);
    p_00 = p_01;
    if (fVerbose != 0) {
      printf("Iter %2d : ");
      Gia_ManPrintStatsShort(p_01);
    }
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupTopAnd( Gia_Man_t * p, int fVerbose )  
{
    Gia_Man_t * pNew, * pTemp;
    int fContinue, iIter = 0;
    pNew = Gia_ManDupNormalize( p, 0 );
    for ( fContinue = 1; fContinue; )
    {
        pNew = Gia_ManDupTopAnd_iter( pTemp = pNew, fVerbose );
        if ( Gia_ManCoNum(pNew) == Gia_ManCoNum(pTemp) && Gia_ManAndNum(pNew) == Gia_ManAndNum(pTemp) )
            fContinue = 0;
        Gia_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Iter %2d : ", ++iIter );
            Gia_ManPrintStatsShort( pNew );
        }
    }
    return pNew;
}